

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

pair<unsigned_long,_bool> __thiscall CConnman::SocketSendData(CConnman *this,CNode *node)

{
  long lVar1;
  _Head_base<0UL,_Transport_*,_false> _Var2;
  const_iterator __first;
  const_iterator __last;
  _Elt_pointer msg_type;
  _Map_pointer ppCVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  size_t sVar7;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> tVar8;
  undefined4 extraout_var;
  int *piVar9;
  element_type *unaff_RBP;
  undefined7 uVar11;
  ulong uVar10;
  _Map_pointer sent_bytes;
  _Elt_pointer this_00;
  long in_FS_OFFSET;
  string_view source_file;
  pair<unsigned_long,_bool> pVar12;
  string_view logging_function;
  undefined8 in_stack_fffffffffffffef8;
  _Elt_pointer in_stack_ffffffffffffff00;
  _Map_pointer ppCVar13;
  _Elt_pointer pCVar14;
  _Elt_pointer pCVar15;
  unsigned_long uVar16;
  Mutex *mutexIn;
  NodeId local_80;
  iterator local_78;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock57;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (node->vSendMsg).
            super__Deque_base<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  pCVar15 = (node->vSendMsg).
            super__Deque_base<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>._M_impl.
            super__Deque_impl_data._M_start._M_first;
  pCVar14 = (node->vSendMsg).
            super__Deque_base<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>._M_impl.
            super__Deque_impl_data._M_start._M_last;
  ppCVar13 = (node->vSendMsg).
             super__Deque_base<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>._M_impl.
             super__Deque_impl_data._M_start._M_node;
  mutexIn = &node->m_sock_mutex;
  uVar16 = 0;
  do {
    if (this_00 !=
        (node->vSendMsg).super__Deque_base<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_cur) {
      sVar7 = CSerializedNetMsg::GetMemoryUsage(this_00);
      _Var2._M_head_impl =
           (node->m_transport)._M_t.
           super___uniq_ptr_impl<Transport,_std::default_delete<Transport>_>._M_t.
           super__Tuple_impl<0UL,_Transport_*,_std::default_delete<Transport>_>.
           super__Head_base<0UL,_Transport_*,_false>._M_head_impl;
      iVar5 = (*(_Var2._M_head_impl)->_vptr_Transport[6])(_Var2._M_head_impl,this_00);
      if ((char)iVar5 != '\0') {
        node->m_send_memusage = node->m_send_memusage - sVar7;
        this_00 = this_00 + 1;
        if (this_00 == pCVar14) {
          this_00 = ppCVar13[1];
          ppCVar13 = ppCVar13 + 1;
          pCVar14 = this_00 + 9;
          pCVar15 = this_00;
        }
      }
    }
    _Var2._M_head_impl =
         (node->m_transport)._M_t.super___uniq_ptr_impl<Transport,_std::default_delete<Transport>_>.
         _M_t.super__Tuple_impl<0UL,_Transport_*,_std::default_delete<Transport>_>.
         super__Head_base<0UL,_Transport_*,_false>._M_head_impl;
    (*(_Var2._M_head_impl)->_vptr_Transport[7])
              (&local_78,_Var2._M_head_impl,
               (ulong)(this_00 !=
                      (node->vSendMsg).
                      super__Deque_base<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>.
                      _M_impl.super__Deque_impl_data._M_finish._M_cur));
    ppCVar3 = local_78._M_node;
    msg_type = local_78._M_cur;
    if (local_78._M_node == (_Map_pointer)0x0) {
LAB_0070c8e5:
      uVar10 = CONCAT71((int7)((ulong)unaff_RBP >> 8),ppCVar3 != (_Map_pointer)0x0);
      goto LAB_0070c8ec;
    }
    uVar6 = 0;
    UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
              (&criticalblock57,mutexIn,"node.m_sock_mutex",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
               ,0x63f,false);
    unaff_RBP = (node->m_sock).super___shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar5 = 3;
    if (unaff_RBP != (element_type *)0x0) {
      uVar6 = (*unaff_RBP->_vptr_Sock[3])
                        (unaff_RBP,local_78._M_last,local_78._M_node,
                         (ulong)((uint)(byte)local_78._M_first << 0xf | 0x4040));
      iVar5 = 0;
    }
    std::unique_lock<std::mutex>::~unique_lock(&criticalblock57.super_unique_lock);
    uVar11 = (undefined7)((ulong)unaff_RBP >> 8);
    if (unaff_RBP != (element_type *)0x0) {
      if ((int)uVar6 < 1) {
        uVar10 = CONCAT71(uVar11,1);
        in_stack_ffffffffffffff00 = this_00;
        if ((int)uVar6 < 0) {
          piVar9 = __errno_location();
          iVar5 = *piVar9;
          in_stack_ffffffffffffff00 = this_00;
          if ((((iVar5 != 4) && (iVar5 != 0xb)) && (iVar5 != 0x5a)) && (iVar5 != 0x73)) {
            bVar4 = ::LogAcceptCategory(NET,Debug);
            if (bVar4) {
              local_80 = node->id;
              NetworkErrorString_abi_cxx11_((string *)&criticalblock57,iVar5);
              source_file._M_str =
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
              ;
              source_file._M_len = 0x57;
              logging_function._M_str = "SocketSendData";
              logging_function._M_len = 0xe;
              LogPrintFormatInternal<long,std::__cxx11::string>
                        (logging_function,source_file,0x661,NET,Debug,
                         (ConstevalFormatString<2U>)0xc989f4,&local_80,(string *)&criticalblock57);
              std::__cxx11::string::~string((string *)&criticalblock57);
            }
            CNode::CloseSocketDisconnect(node);
          }
        }
        goto LAB_0070c8ec;
      }
      tVar8 = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>
                        ();
      LOCK();
      (node->m_last_send)._M_i.__r = (rep)tVar8.__d.__r;
      UNLOCK();
      sent_bytes = (_Map_pointer)(ulong)uVar6;
      node->nSendBytes = node->nSendBytes + (long)sent_bytes;
      _Var2._M_head_impl =
           (node->m_transport)._M_t.
           super___uniq_ptr_impl<Transport,_std::default_delete<Transport>_>._M_t.
           super__Tuple_impl<0UL,_Transport_*,_std::default_delete<Transport>_>.
           super__Head_base<0UL,_Transport_*,_false>._M_head_impl;
      (*(_Var2._M_head_impl)->_vptr_Transport[8])(_Var2._M_head_impl,sent_bytes);
      if ((msg_type->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
          .super__Vector_impl_data._M_finish != (pointer)0x0) {
        CNode::AccountForSentBytes(node,(string *)msg_type,(size_t)sent_bytes);
      }
      uVar16 = uVar16 + (long)sent_bytes;
      iVar5 = 0;
      in_stack_ffffffffffffff00 = this_00;
      if (local_78._M_node != sent_bytes) goto LAB_0070c8e5;
    }
    in_stack_ffffffffffffff00 = this_00;
  } while (iVar5 == 0);
  uVar10 = CONCAT71(uVar11,1);
LAB_0070c8ec:
  sVar7 = node->m_send_memusage;
  iVar5 = (*((node->m_transport)._M_t.
             super___uniq_ptr_impl<Transport,_std::default_delete<Transport>_>._M_t.
             super__Tuple_impl<0UL,_Transport_*,_std::default_delete<Transport>_>.
             super__Head_base<0UL,_Transport_*,_false>._M_head_impl)->_vptr_Transport[9])();
  LOCK();
  (node->fPauseSend)._M_base._M_i =
       (ulong)this->nSendBufferMaxSize < CONCAT44(extraout_var,iVar5) + sVar7;
  UNLOCK();
  if ((this_00 ==
       (node->vSendMsg).super__Deque_base<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>.
       _M_impl.super__Deque_impl_data._M_finish._M_cur) && (node->m_send_memusage != 0)) {
    __assert_fail("node.m_send_memusage == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
                  ,0x66c,"std::pair<size_t, bool> CConnman::SocketSendData(CNode &) const");
  }
  __first._M_first = in_stack_ffffffffffffff00;
  __first._M_cur = (_Elt_pointer)in_stack_fffffffffffffef8;
  __first._M_last = (_Elt_pointer)ppCVar13;
  __first._M_node = (_Map_pointer)pCVar14;
  __last._M_first = (_Elt_pointer)uVar16;
  __last._M_cur = pCVar15;
  __last._M_last = (_Elt_pointer)this;
  __last._M_node = (_Map_pointer)mutexIn;
  std::deque<CSerializedNetMsg,_std::allocator<CSerializedNetMsg>_>::erase
            (&local_78,&node->vSendMsg,__first,__last);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  pVar12._8_8_ = uVar10 & 0xffffffff;
  pVar12.first = uVar16;
  return pVar12;
}

Assistant:

std::pair<size_t, bool> CConnman::SocketSendData(CNode& node) const
{
    auto it = node.vSendMsg.begin();
    size_t nSentSize = 0;
    bool data_left{false}; //!< second return value (whether unsent data remains)
    std::optional<bool> expected_more;

    while (true) {
        if (it != node.vSendMsg.end()) {
            // If possible, move one message from the send queue to the transport. This fails when
            // there is an existing message still being sent, or (for v2 transports) when the
            // handshake has not yet completed.
            size_t memusage = it->GetMemoryUsage();
            if (node.m_transport->SetMessageToSend(*it)) {
                // Update memory usage of send buffer (as *it will be deleted).
                node.m_send_memusage -= memusage;
                ++it;
            }
        }
        const auto& [data, more, msg_type] = node.m_transport->GetBytesToSend(it != node.vSendMsg.end());
        // We rely on the 'more' value returned by GetBytesToSend to correctly predict whether more
        // bytes are still to be sent, to correctly set the MSG_MORE flag. As a sanity check,
        // verify that the previously returned 'more' was correct.
        if (expected_more.has_value()) Assume(!data.empty() == *expected_more);
        expected_more = more;
        data_left = !data.empty(); // will be overwritten on next loop if all of data gets sent
        int nBytes = 0;
        if (!data.empty()) {
            LOCK(node.m_sock_mutex);
            // There is no socket in case we've already disconnected, or in test cases without
            // real connections. In these cases, we bail out immediately and just leave things
            // in the send queue and transport.
            if (!node.m_sock) {
                break;
            }
            int flags = MSG_NOSIGNAL | MSG_DONTWAIT;
#ifdef MSG_MORE
            if (more) {
                flags |= MSG_MORE;
            }
#endif
            nBytes = node.m_sock->Send(reinterpret_cast<const char*>(data.data()), data.size(), flags);
        }
        if (nBytes > 0) {
            node.m_last_send = GetTime<std::chrono::seconds>();
            node.nSendBytes += nBytes;
            // Notify transport that bytes have been processed.
            node.m_transport->MarkBytesSent(nBytes);
            // Update statistics per message type.
            if (!msg_type.empty()) { // don't report v2 handshake bytes for now
                node.AccountForSentBytes(msg_type, nBytes);
            }
            nSentSize += nBytes;
            if ((size_t)nBytes != data.size()) {
                // could not send full message; stop sending more
                break;
            }
        } else {
            if (nBytes < 0) {
                // error
                int nErr = WSAGetLastError();
                if (nErr != WSAEWOULDBLOCK && nErr != WSAEMSGSIZE && nErr != WSAEINTR && nErr != WSAEINPROGRESS) {
                    LogDebug(BCLog::NET, "socket send error for peer=%d: %s\n", node.GetId(), NetworkErrorString(nErr));
                    node.CloseSocketDisconnect();
                }
            }
            break;
        }
    }

    node.fPauseSend = node.m_send_memusage + node.m_transport->GetSendMemoryUsage() > nSendBufferMaxSize;

    if (it == node.vSendMsg.end()) {
        assert(node.m_send_memusage == 0);
    }
    node.vSendMsg.erase(node.vSendMsg.begin(), it);
    return {nSentSize, data_left};
}